

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_async_dir(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  uv_dirent_t dent_00;
  uv_dirent_t dent;
  
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_mkdir(::loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    uv_run(::loop,0);
    if (mkdir_cb_count == 1) {
      iVar1 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
      if (iVar1 < 0) {
        pcVar4 = "r >= 0";
        uVar2 = 0x45b;
      }
      else {
        uv_fs_req_cleanup(&open_req1);
        iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
        if (iVar1 == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar1 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
          if (iVar1 < 0) {
            pcVar4 = "r >= 0";
            uVar2 = 0x463;
          }
          else {
            uv_fs_req_cleanup(&open_req1);
            iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
            if (iVar1 == 0) {
              uv_fs_req_cleanup(&close_req);
              iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
              if (iVar1 == 0) {
                uv_run(::loop,0);
                if (scandir_cb_count == 1) {
                  iVar1 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
                  if (iVar1 == 2) {
                    if (scandir_req.result == 2) {
                      if (scandir_req.ptr == (void *)0x0) {
                        pcVar4 = "scandir_req.ptr";
                        uVar2 = 0x473;
                      }
                      else {
                        while (iVar1 = uv_fs_scandir_next(&scandir_req,&dent), pcVar4 = dent.name,
                              iVar1 != -0xfff) {
                          pcVar3 = "file1";
                          iVar1 = strcmp(dent.name,"file1");
                          if (iVar1 != 0) {
                            pcVar3 = "file2";
                            iVar1 = strcmp(pcVar4,"file2");
                            if (iVar1 != 0) {
                              pcVar4 = 
                              "strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0"
                              ;
                              uVar2 = 0x475;
                              goto LAB_00120fd6;
                            }
                          }
                          dent_00.name = (char *)(ulong)dent.type;
                          dent_00._8_8_ = pcVar3;
                          assert_is_file_type(dent_00);
                        }
                        uv_fs_req_cleanup(&scandir_req);
                        if (scandir_req.ptr == (void *)0x0) {
                          iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
                          if (iVar1 == 0) {
                            uv_run(::loop,0);
                            iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
                            if (iVar1 == 0) {
                              uv_run(::loop,0);
                              iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
                              if (iVar1 == 0) {
                                uv_run(::loop,0);
                                iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
                                if (iVar1 == 0) {
                                  uv_run(::loop,0);
                                  if (stat_cb_count == 4) {
                                    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",
                                                         unlink_cb);
                                    if (iVar1 == 0) {
                                      uv_run(::loop,0);
                                      if (unlink_cb_count == 1) {
                                        iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",
                                                             unlink_cb);
                                        if (iVar1 == 0) {
                                          uv_run(::loop,0);
                                          if (unlink_cb_count == 2) {
                                            iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",
                                                                rmdir_cb);
                                            if (iVar1 == 0) {
                                              uv_run(::loop,0);
                                              if (rmdir_cb_count == 1) {
                                                unlink("test_dir/file1");
                                                unlink("test_dir/file2");
                                                rmdir("test_dir");
                                                loop = (uv_loop_t *)uv_default_loop();
                                                close_loop(loop);
                                                uVar2 = uv_default_loop();
                                                iVar1 = uv_loop_close(uVar2);
                                                if (iVar1 == 0) {
                                                  uv_library_shutdown();
                                                  return 0;
                                                }
                                                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                                uVar2 = 0x4a1;
                                              }
                                              else {
                                                pcVar4 = "rmdir_cb_count == 1";
                                                uVar2 = 0x49a;
                                              }
                                            }
                                            else {
                                              pcVar4 = "r == 0";
                                              uVar2 = 0x498;
                                            }
                                          }
                                          else {
                                            pcVar4 = "unlink_cb_count == 2";
                                            uVar2 = 0x495;
                                          }
                                        }
                                        else {
                                          pcVar4 = "r == 0";
                                          uVar2 = 0x493;
                                        }
                                      }
                                      else {
                                        pcVar4 = "unlink_cb_count == 1";
                                        uVar2 = 0x490;
                                      }
                                    }
                                    else {
                                      pcVar4 = "r == 0";
                                      uVar2 = 0x48e;
                                    }
                                  }
                                  else {
                                    pcVar4 = "stat_cb_count == 4";
                                    uVar2 = 0x48b;
                                  }
                                }
                                else {
                                  pcVar4 = "r == 0";
                                  uVar2 = 0x488;
                                }
                              }
                              else {
                                pcVar4 = "r == 0";
                                uVar2 = 0x484;
                              }
                            }
                            else {
                              pcVar4 = "r == 0";
                              uVar2 = 0x480;
                            }
                          }
                          else {
                            pcVar4 = "r == 0";
                            uVar2 = 0x47c;
                          }
                        }
                        else {
                          pcVar4 = "!scandir_req.ptr";
                          uVar2 = 0x479;
                        }
                      }
                    }
                    else {
                      pcVar4 = "scandir_req.result == 2";
                      uVar2 = 0x472;
                    }
                  }
                  else {
                    pcVar4 = "r == 2";
                    uVar2 = 0x471;
                  }
                }
                else {
                  pcVar4 = "scandir_cb_count == 1";
                  uVar2 = 0x46d;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar2 = 0x46a;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar2 = 0x466;
            }
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar2 = 0x45e;
        }
      }
    }
    else {
      pcVar4 = "mkdir_cb_count == 1";
      uVar2 = 0x456;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar2 = 0x453;
  }
LAB_00120fd6:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_async_dir) {
  int r;
  uv_dirent_t dent;

  /* Setup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  loop = uv_default_loop();

  r = uv_fs_mkdir(loop, &mkdir_req, "test_dir", 0755, mkdir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdir_cb_count == 1);

  /* Create 2 files synchronously. */
  r = uv_fs_open(NULL, &open_req1, "test_dir/file1", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_scandir(loop, &scandir_req, "test_dir", 0, scandir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  /* sync uv_fs_scandir */
  r = uv_fs_scandir(NULL, &scandir_req, "test_dir", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  r = uv_fs_stat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_stat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(stat_cb_count == 4);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file1", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 1);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file2", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 2);

  r = uv_fs_rmdir(loop, &rmdir_req, "test_dir", rmdir_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(rmdir_cb_count == 1);

  /* Cleanup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}